

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::String::FormatByte_abi_cxx11_(uchar value)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  byte in_SIL;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  undefined1 auStack_188 [383];
  byte local_9;
  
  local_9 = in_SIL;
  std::__cxx11::stringstream::stringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(auStack_188,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::uppercase);
  std::ostream::operator<<(pvVar4,(uint)local_9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}